

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_norm_wt_mmie_var
               (vector_t ***in_var,vector_t ***wt_var,vector_t ***wt_num_var,vector_t ***wt_den_var,
               float32 ***num_dnom,float32 ***den_dnom,vector_t ***in_mean,vector_t ***wt_mean,
               vector_t ***wt_num_mean,vector_t ***wt_den_mean,uint32 n_mgau,uint32 n_feat,
               uint32 n_density,uint32 *veclen,float32 constE)

{
  float den_dnom_00;
  uint uVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  vector_t **pppfVar4;
  vector_t **pppfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float32 fVar10;
  float fVar11;
  
  if (n_mgau != 0) {
    uVar8 = 0;
    do {
      if (n_feat != 0) {
        uVar6 = 0;
        do {
          if (n_density != 0) {
            uVar9 = 0;
            do {
              fVar11 = (float)num_dnom[uVar8][uVar6][uVar9];
              den_dnom_00 = (float)den_dnom[uVar8][uVar6][uVar9];
              if ((((fVar11 != 0.0) || (NAN(fVar11))) || (den_dnom_00 != 0.0)) || (NAN(den_dnom_00))
                 ) {
                fVar10 = cal_constD(in_mean[uVar8][uVar6][uVar9],wt_num_mean[uVar8][uVar6][uVar9],
                                    wt_den_mean[uVar8][uVar6][uVar9],in_var[uVar8][uVar6][uVar9],
                                    wt_num_var[uVar8][uVar6][uVar9],wt_den_var[uVar8][uVar6][uVar9],
                                    (float32)fVar11,(float32)den_dnom_00,veclen[uVar6],constE);
                if ((uint)ABS((float)fVar10) < 0x7f800000) {
                  if (veclen[uVar6] != 0) {
                    pppfVar4 = in_var[uVar8];
                    pppfVar5 = wt_var[uVar8];
                    uVar7 = 0;
                    do {
                      fVar11 = ((in_mean[uVar8][uVar6][uVar9][uVar7] *
                                 in_mean[uVar8][uVar6][uVar9][uVar7] + pppfVar4[uVar6][uVar9][uVar7]
                                ) * (float)fVar10 +
                               (wt_num_var[uVar8][uVar6][uVar9][uVar7] -
                               wt_den_var[uVar8][uVar6][uVar9][uVar7])) /
                               (((float)num_dnom[uVar8][uVar6][uVar9] -
                                (float)den_dnom[uVar8][uVar6][uVar9]) + (float)fVar10) -
                               wt_mean[uVar8][uVar6][uVar9][uVar7] *
                               wt_mean[uVar8][uVar6][uVar9][uVar7];
                      pppfVar5[uVar6][uVar9][uVar7] = fVar11;
                      if ((uint)ABS(fVar11) < 0x7f800000) {
                        if (fVar11 < 0.0) {
                          err_msg(ERR_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                  ,0x870,
                                  "Variance of the senone (mgau= %u, feat= %u, density=%u, component=%u) < 0\n"
                                  ,uVar8 & 0xffffffff,uVar6 & 0xffffffff,uVar9,uVar7);
                          goto LAB_0011fa9a;
                        }
                      }
                      else {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x869,
                                "The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n"
                                ,SUB84((double)fVar11,0),uVar8 & 0xffffffff,uVar6 & 0xffffffff,uVar9
                                ,uVar7);
LAB_0011fa9a:
                        pppfVar4 = in_var[uVar8];
                        pppfVar5 = wt_var[uVar8];
                        pppfVar5[uVar6][uVar9][uVar7] = pppfVar4[uVar6][uVar9][uVar7];
                      }
                      uVar7 = uVar7 + 1;
                    } while (uVar7 < veclen[uVar6]);
                  }
                }
                else {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x85b,
                          "Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n"
                          ,SUB84((double)(float)fVar10,0),uVar8 & 0xffffffff,uVar6 & 0xffffffff,
                          uVar9);
                  uVar1 = veclen[uVar6];
                  if ((ulong)uVar1 != 0) {
                    pfVar2 = in_var[uVar8][uVar6][uVar9];
                    pfVar3 = wt_var[uVar8][uVar6][uVar9];
                    uVar7 = 0;
                    do {
                      pfVar3[uVar7] = pfVar2[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar1 != uVar7);
                  }
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != n_density);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != n_feat);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_norm_wt_mmie_var(vector_t ***in_var,
			vector_t ***wt_var,
			vector_t ***wt_num_var,
			vector_t ***wt_den_var,
			float32 ***num_dnom,
			float32 ***den_dnom,
			vector_t ***in_mean,
			vector_t ***wt_mean,
			vector_t ***wt_num_mean,
			vector_t ***wt_den_mean,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen,
			float32 constE)
{
    uint32 i, j, k, l;
    float32 d_mmi = 0.0;
    
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (num_dnom[i][j][k] != 0 || den_dnom[i][j][k] != 0) {
		        
		    /* compute constant D, which controls the convergence speed and accuracy */
		    d_mmi = cal_constD(in_mean[i][j][k], wt_num_mean[i][j][k], wt_den_mean[i][j][k],
				       in_var[i][j][k], wt_num_var[i][j][k], wt_den_var[i][j][k], num_dnom[i][j][k], den_dnom[i][j][k], veclen[j], constE);
		    if (!finite(d_mmi)) {
			E_ERROR("Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n", d_mmi, i, j, k);
    			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
    			}
			continue;
		    }
		        
		    /* update variance parameters */
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = ((wt_num_var[i][j][k][l] - wt_den_var[i][j][k][l]) + 
					      d_mmi * (in_var[i][j][k][l] + in_mean[i][j][k][l] * in_mean[i][j][k][l])) / 
			    (num_dnom[i][j][k] - den_dnom[i][j][k] + d_mmi)
			    - (wt_mean[i][j][k][l] * wt_mean[i][j][k][l]);
			if (!finite(wt_var[i][j][k][l])) {
			    E_ERROR("The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n", wt_var[i][j][k][l], i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			    continue;
			}
			
			/* if the new var<0, keep it unchanged */
			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance of the senone (mgau= %u, feat= %u, ""density=%u, component=%u) < 0\n", i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}